

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotShaded<float>
               (char *label_id,float *xs,float *ys,int count,double y_ref,int offset,int stride)

{
  undefined1 local_c0 [8];
  GetterXsYRef<float> getter2;
  GetterXsYs<float> getter1;
  double local_68;
  ImPlotLimits local_60;
  byte local_39;
  int local_38;
  int iStack_34;
  bool fit2;
  int stride_local;
  int offset_local;
  double y_ref_local;
  float *pfStack_20;
  int count_local;
  float *ys_local;
  float *xs_local;
  char *label_id_local;
  
  local_39 = 1;
  local_38 = stride;
  iStack_34 = offset;
  _stride_local = y_ref;
  y_ref_local._4_4_ = count;
  pfStack_20 = ys;
  ys_local = xs;
  xs_local = (float *)label_id;
  if ((y_ref == -INFINITY) && (!NAN(y_ref))) {
    local_39 = 0;
    GetPlotLimits(&local_60,-1);
    _stride_local = local_60.Y.Min;
  }
  if ((_stride_local == INFINITY) && (!NAN(_stride_local))) {
    local_39 = 0;
    GetPlotLimits((ImPlotLimits *)&getter1.Stride,-1);
    _stride_local = local_68;
  }
  GetterXsYs<float>::GetterXsYs
            ((GetterXsYs<float> *)&getter2.Stride,ys_local,pfStack_20,y_ref_local._4_4_,iStack_34,
             local_38);
  GetterXsYRef<float>::GetterXsYRef
            ((GetterXsYRef<float> *)local_c0,ys_local,_stride_local,y_ref_local._4_4_,iStack_34,
             local_38);
  PlotShadedEx<ImPlot::GetterXsYs<float>,ImPlot::GetterXsYRef<float>>
            ((char *)xs_local,(GetterXsYs<float> *)&getter2.Stride,(GetterXsYRef<float> *)local_c0,
             (bool)(local_39 & 1));
  return;
}

Assistant:

void PlotShaded(const char* label_id, const T* xs, const T* ys, int count, double y_ref, int offset, int stride) {
    bool fit2 = true;
    if (y_ref == -HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Min;
    }
    if (y_ref == HUGE_VAL) {
        fit2 = false;
        y_ref = GetPlotLimits().Y.Max;
    }
    GetterXsYs<T> getter1(xs, ys, count, offset, stride);
    GetterXsYRef<T> getter2(xs, y_ref, count, offset, stride);
    PlotShadedEx(label_id, getter1, getter2, fit2);
}